

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_import(lysp_yin_ctx *ctx,import_meta *imp_meta)

{
  char *pcVar1;
  lysp_import *plVar2;
  lysp_ext_instance *object;
  lysp_import *plVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  undefined8 *puVar6;
  long lVar7;
  yin_subelement subelems [5];
  yin_subelement local_a8;
  undefined4 local_90;
  char **local_88;
  undefined2 local_80;
  undefined4 local_78;
  char **local_70;
  undefined2 local_68;
  undefined4 local_60;
  char *local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  plVar2 = *imp_meta->imports;
  if (plVar2 == (lysp_import *)0x0) {
    puVar6 = (undefined8 *)malloc(0x48);
    if (puVar6 != (undefined8 *)0x0) {
      *puVar6 = 1;
      goto LAB_0018974d;
    }
  }
  else {
    lVar7 = *(long *)(plVar2[-1].rev + 6) + 1;
    *(long *)(plVar2[-1].rev + 6) = lVar7;
    puVar6 = (undefined8 *)realloc(plVar2[-1].rev + 6,lVar7 * 0x40 | 8);
    if (puVar6 != (undefined8 *)0x0) {
LAB_0018974d:
      *imp_meta->imports = (lysp_import *)(puVar6 + 1);
      plVar2 = *imp_meta->imports;
      lVar7 = *(long *)(plVar2[-1].rev + 6);
      local_a8.dest = &plVar2[lVar7 + -1].dsc;
      plVar3 = plVar2 + lVar7 + -1;
      plVar3->flags = 0;
      plVar3->rev[0] = '\0';
      plVar3->rev[1] = '\0';
      plVar3->rev[2] = '\0';
      plVar3->rev[3] = '\0';
      plVar3->rev[4] = '\0';
      plVar3->rev[5] = '\0';
      *(undefined8 *)(plVar2[lVar7 + -1].rev + 6) = 0;
      plVar2[lVar7 + -1].ref = (char *)0x0;
      plVar2[lVar7 + -1].exts = (lysp_ext_instance *)0x0;
      plVar2[lVar7 + -1].prefix = (char *)0x0;
      plVar2[lVar7 + -1].dsc = (char *)0x0;
      plVar2[lVar7 + -1].module = (lys_module *)0x0;
      plVar2[lVar7 + -1].name = (char *)0x0;
      local_a8.type = LY_STMT_DESCRIPTION;
      local_a8.flags = 2;
      local_90 = 0x240000;
      local_80 = 3;
      local_78 = 0x270000;
      local_70 = &plVar2[lVar7 + -1].ref;
      local_68 = 2;
      local_60 = 0x2b0000;
      local_58 = plVar2[lVar7 + -1].rev;
      local_50 = 2;
      uStack_40 = 0;
      local_38 = 0;
      local_48 = 0xf0000;
      local_88 = &plVar2[lVar7 + -1].prefix;
      LVar4 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar4 != LY_SUCCESS) {
        return LVar4 + (LVar4 == LY_SUCCESS);
      }
      LVar4 = yin_parse_attribute(ctx,YIN_ARG_MODULE,&plVar2[lVar7 + -1].name,Y_IDENTIF_ARG,
                                  LY_STMT_IMPORT);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      LVar5 = LY_SUCCESS;
      LVar4 = yin_parse_content(ctx,&local_a8,5,plVar2 + lVar7 + -1,LY_STMT_IMPORT,(char **)0x0,
                                &plVar2[lVar7 + -1].exts);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      object = plVar2[lVar7 + -1].exts;
      if (object != (lysp_ext_instance *)0x0) {
        LVar5 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
      }
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      LVar4 = lysp_check_prefix((lysp_ctx *)ctx,*imp_meta->imports,imp_meta->prefix,
                                &plVar2[lVar7 + -1].prefix);
      if (LVar4 != LY_SUCCESS) {
        return LY_EVALID;
      }
      return LY_SUCCESS;
    }
    pcVar1 = (*imp_meta->imports)[-1].rev + 6;
    *(long *)pcVar1 = *(long *)pcVar1 + -1;
  }
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_import");
  return LY_EMEM;
}

Assistant:

static LY_ERR
yin_parse_import(struct lysp_yin_ctx *ctx, struct import_meta *imp_meta)
{
    struct lysp_import *imp;

    /* allocate new element in sized array for import */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *imp_meta->imports, imp, LY_EMEM);

    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &imp->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_PREFIX, &imp->prefix, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &imp->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REVISION_DATE, imp->rev, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    /* parse import attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_MODULE, &imp->name, Y_IDENTIF_ARG, LY_STMT_IMPORT));
    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), imp, LY_STMT_IMPORT, NULL, &imp->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, imp->exts));

    /* check prefix validity */
    LY_CHECK_RET(lysp_check_prefix((struct lysp_ctx *)ctx, *imp_meta->imports, imp_meta->prefix, &imp->prefix), LY_EVALID);

    return LY_SUCCESS;
}